

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O1

void __thiscall
fmt::v11::detail::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,color_type text_color,char *esc)

{
  int i;
  int iVar1;
  long lVar2;
  size_t sVar3;
  char cVar4;
  uint uVar5;
  size_t __n;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (((ulong)text_color & 1) == 0) {
    sVar3 = strlen(esc);
    uVar9 = (ulong)text_color >> 0x20 & 0xff;
    __n = 7;
    if (sVar3 < 7) {
      __n = sVar3;
    }
    uVar8 = (ulong)((int)uVar9 + 10);
    if (sVar3 != 7) {
      uVar8 = uVar9;
    }
    iVar1 = bcmp(esc,"\x1b[48;2;",__n);
    if (iVar1 != 0) {
      uVar8 = uVar9;
    }
    this->buffer[0] = '\x1b';
    this->buffer[1] = '[';
    lVar2 = 2;
    if (99 < (uint)uVar8) {
      this->buffer[2] = '1';
      uVar8 = (ulong)((uint)uVar8 + (int)(uVar8 / 100) * -100);
      lVar2 = 3;
    }
    pcVar6 = this->buffer + lVar2;
    pcVar7 = pcVar6 + 3;
    *pcVar6 = (byte)(uVar8 / 10) | 0x30;
    pcVar6[1] = (char)uVar8 + ((char)(uVar8 / 10) + (char)(uVar8 / 10)) * -5 | 0x30;
    pcVar6[2] = 0x6d;
  }
  else {
    lVar2 = 0;
    do {
      this->buffer[lVar2] = esc[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 7);
    uVar5 = text_color.value._2_2_ & 0xff;
    this->buffer[7] = (byte)(uVar5 * 0x29 >> 0xc) | 0x30;
    uVar5 = uVar5 / 10;
    cVar4 = (char)uVar5;
    this->buffer[8] = cVar4 + ((byte)(uVar5 / 5) & 6) * -5 | 0x30;
    this->buffer[9] = text_color.value._2_1_ + cVar4 * -10 | 0x30;
    this->buffer[10] = ';';
    uVar5 = text_color.value.rgb_color >> 8 & 0xff;
    this->buffer[0xb] = (byte)(uVar5 * 0x29 >> 0xc) | 0x30;
    uVar5 = uVar5 / 10;
    cVar4 = (char)uVar5;
    this->buffer[0xc] = cVar4 + ((byte)(uVar5 / 5) & 6) * -5 | 0x30;
    this->buffer[0xd] = text_color.value._1_1_ + cVar4 * -10 | 0x30;
    this->buffer[0xe] = ';';
    uVar5 = text_color.value.rgb_color & 0xff;
    this->buffer[0xf] = (byte)(uVar5 * 0x29 >> 0xc) | 0x30;
    uVar5 = uVar5 / 10;
    cVar4 = (char)uVar5;
    this->buffer[0x10] = cVar4 + ((byte)(uVar5 / 5) & 6) * -5 | 0x30;
    this->buffer[0x11] = text_color.value._0_1_ + cVar4 * -10 | 0x30;
    this->buffer[0x12] = 'm';
    pcVar7 = this->buffer + 0x13;
  }
  *pcVar7 = 0;
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(color_type text_color,
                                  const char* esc) noexcept {
    // If we have a terminal color, we need to output another escape code
    // sequence.
    if (!text_color.is_rgb) {
      bool is_background = esc == string_view("\x1b[48;2;");
      uint32_t value = text_color.value.term_color;
      // Background ASCII codes are the same as the foreground ones but with
      // 10 more.
      if (is_background) value += 10u;

      size_t index = 0;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');

      if (value >= 100u) {
        buffer[index++] = static_cast<Char>('1');
        value %= 100u;
      }
      buffer[index++] = static_cast<Char>('0' + value / 10u);
      buffer[index++] = static_cast<Char>('0' + value % 10u);

      buffer[index++] = static_cast<Char>('m');
      buffer[index++] = static_cast<Char>('\0');
      return;
    }

    for (int i = 0; i < 7; i++) {
      buffer[i] = static_cast<Char>(esc[i]);
    }
    rgb color(text_color.value.rgb_color);
    to_esc(color.r, buffer + 7, ';');
    to_esc(color.g, buffer + 11, ';');
    to_esc(color.b, buffer + 15, 'm');
    buffer[19] = static_cast<Char>(0);
  }